

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O3

void __thiscall astar::AStar::MigratePoint(AStar *this,PointCost *pc,Point *start,Point *end)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  iterator iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int (*paiVar9) [2];
  Point tmp;
  int cost;
  undefined1 local_81;
  Point local_80;
  shared_ptr<astar::AStar::PointCost> local_78;
  int local_64;
  Point *local_60;
  vector<astar::AStar::PointCost,std::allocator<astar::AStar::PointCost>> *local_58;
  priority_queue<astar::AStar::PointCost,_std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>,_std::less<astar::AStar::PointCost>_>
  local_50;
  
  if (0 < (int)this->moveType) {
    local_58 = (vector<astar::AStar::PointCost,std::allocator<astar::AStar::PointCost>> *)
               &this->openZone;
    paiVar9 = MigratePoint::move;
    lVar8 = 0;
    local_60 = end;
    do {
      local_78.super___shared_ptr<astar::AStar::PointCost,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)paiVar9;
      local_80 = operator+(&pc->point,(Point *)&local_78);
      iVar1 = (this->map).m;
      uVar3 = local_80.x;
      if ((int)uVar3 < iVar1) {
        uVar5 = local_80.y;
        if ((((-1 < (int)(uVar5 | uVar3)) && ((int)uVar5 < (this->map).n)) &&
            (iVar6 = *(int *)(*(long *)&(this->map).map.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start
                                        [(ulong)local_80 & 0xffffffff].
                                        super__Vector_base<int,_std::allocator<int>_> +
                             ((ulong)local_80 >> 0x20) * 4), iVar6 != 1)) && (iVar6 != 0x7fffffff))
        {
          local_78.super___shared_ptr<astar::AStar::PointCost,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               CONCAT44(local_78.
                        super___shared_ptr<astar::AStar::PointCost,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr._4_4_,iVar1 * uVar5 + uVar3);
          iVar4 = std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->closeZone)._M_h,(key_type *)&local_78);
          if (iVar4.super__Node_iterator_base<std::pair<const_unsigned_int,_int>,_false>._M_cur ==
              (__node_type *)0x0) {
            std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>::vector
                      (&local_50.c,
                       (vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_> *)
                       local_58);
            bVar2 = InOpenZone(this,&local_50,&local_80);
            std::vector<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>::~vector
                      (&local_50.c);
            if (!bVar2) {
              local_64 = pc->cost;
              iVar6 = (pc->point).x - local_80.x;
              iVar1 = -iVar6;
              if (0 < iVar6) {
                iVar1 = iVar6;
              }
              iVar7 = (pc->point).y - local_80.y;
              iVar6 = -iVar7;
              if (0 < iVar7) {
                iVar6 = iVar7;
              }
              if (this->moveType == D8) {
                if (iVar6 < iVar1) {
                  iVar6 = iVar1;
                }
                local_64 = local_64 + iVar6;
                iVar6 = local_80.x - local_60->x;
                iVar1 = -iVar6;
                if (0 < iVar6) {
                  iVar1 = iVar6;
                }
                iVar6 = local_80.y - local_60->y;
                iVar7 = -iVar6;
                if (0 < iVar6) {
                  iVar7 = iVar6;
                }
                if (iVar7 < iVar1) {
                  iVar7 = iVar1;
                }
              }
              else {
                iVar7 = 0;
                if (this->moveType == D4) {
                  local_64 = iVar1 + local_64 + iVar6;
                  iVar6 = local_80.x - local_60->x;
                  iVar1 = -iVar6;
                  if (0 < iVar6) {
                    iVar1 = iVar6;
                  }
                  iVar7 = local_80.y - local_60->y;
                  iVar6 = -iVar7;
                  if (0 < iVar7) {
                    iVar6 = iVar7;
                  }
                  iVar7 = iVar6 + iVar1;
                }
              }
              local_64 = local_64 + iVar7;
              local_78.super___shared_ptr<astar::AStar::PointCost,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<astar::AStar::PointCost,std::allocator<astar::AStar::PointCost>,astar::AStar::PointCost_const&>
                        (&local_78.
                          super___shared_ptr<astar::AStar::PointCost,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(PointCost **)&local_78,
                         (allocator<astar::AStar::PointCost> *)&local_81,pc);
              std::vector<astar::AStar::PointCost,std::allocator<astar::AStar::PointCost>>::
              emplace_back<astar::Point&,int&,std::shared_ptr<astar::AStar::PointCost>>
                        (local_58,&local_80,&local_64,&local_78);
              std::
              push_heap<__gnu_cxx::__normal_iterator<astar::AStar::PointCost*,std::vector<astar::AStar::PointCost,std::allocator<astar::AStar::PointCost>>>,std::less<astar::AStar::PointCost>>
                        ((this->openZone).c.
                         super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->openZone).c.
                         super__Vector_base<astar::AStar::PointCost,_std::allocator<astar::AStar::PointCost>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              if (local_78.super___shared_ptr<astar::AStar::PointCost,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_78.
                           super___shared_ptr<astar::AStar::PointCost,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
          }
        }
      }
      lVar8 = lVar8 + 1;
      paiVar9 = (int (*) [2])&((Point *)paiVar9)[1].x;
    } while (lVar8 < (int)this->moveType);
  }
  return;
}

Assistant:

void MigratePoint(const PointCost& pc, const Point& start, const Point& end)
    {
        // up, down, left, right, diagonal up right, diagonal down right, diagonal down left, diagonal up left
        static int move[8][2] = {{0, -1}, {0, 1}, {-1, 0}, {1, 0}, {1, -1}, {1, 1}, {-1, 1}, {-1, -1}};
        for (int i = 0; i < moveType; i++) {
            auto tmp = pc.point + Point(move[i][0], move[i][1]);
            if (PointVaild(tmp)) {
                if (closeZone.find(tmp.x + tmp.y * map.Width()) != closeZone.end()) {
                    continue;
                }
                if (!InOpenZone(openZone, tmp)) {
                    int cost = pc.cost + MoveCast(pc.point, tmp) + MoveCast(tmp, end);
                    openZone.emplace(tmp, cost, std::make_shared<PointCost>(pc));
                }
            }
        }
    }